

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

bool __thiscall
pybind11::detail::
type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
load(type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     *this,handle src,bool param_2)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  PyObject **ppPVar4;
  PyObject *pPVar5;
  ulong uVar6;
  allocator local_99;
  string local_98 [32];
  ulong local_78;
  size_t length;
  char *buffer;
  handle local_60;
  object utfNbytes;
  object local_50;
  undefined4 local_48;
  handle local_38;
  handle load_src;
  object temp;
  bool param_2_local;
  type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *this_local;
  handle src_local;
  
  this_local = (type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *)src.m_ptr;
  object::object((object *)&load_src);
  local_38.m_ptr = (PyObject *)this_local;
  bVar2 = handle::operator_cast_to_bool((handle *)&this_local);
  if (bVar2) {
    ppPVar4 = handle::ptr(&local_38);
    iVar3 = PyType_HasFeature((*ppPVar4)->ob_type,0x10000000);
    if (iVar3 == 0) {
      ppPVar4 = handle::ptr(&local_38);
      pPVar5 = (PyObject *)PyUnicode_FromObject(*ppPVar4);
      handle::handle(&utfNbytes.super_handle,pPVar5);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_50,utfNbytes.super_handle.m_ptr);
      object::operator=((object *)&load_src,&local_50);
      object::~object(&local_50);
      bVar2 = handle::operator_cast_to_bool(&load_src);
      if (!bVar2) {
        PyErr_Clear();
        src_local.m_ptr._7_1_ = 0;
        local_48 = 1;
        goto LAB_001d5971;
      }
      local_38.m_ptr = load_src.m_ptr;
    }
    ppPVar4 = handle::ptr(&local_38);
    pPVar5 = (PyObject *)PyUnicode_AsEncodedString(*ppPVar4,"utf8",0);
    handle::handle((handle *)&buffer,pPVar5);
    reinterpret_steal<pybind11::object>((pybind11 *)&local_60,(handle)buffer);
    bVar2 = handle::operator_cast_to_bool(&local_60);
    if (bVar2) {
      ppPVar4 = handle::ptr(&local_60);
      length = PyBytes_AsString(*ppPVar4);
      ppPVar4 = handle::ptr(&local_60);
      uVar6 = PyBytes_Size(*ppPVar4);
      sVar1 = length;
      local_78 = uVar6;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_98,(char *)sVar1,uVar6,&local_99);
      std::__cxx11::string::operator=((string *)this,local_98);
      std::__cxx11::string::~string(local_98);
      std::allocator<char>::~allocator((allocator<char> *)&local_99);
    }
    else {
      PyErr_Clear();
    }
    local_48 = 1;
    src_local.m_ptr._7_1_ = bVar2;
    object::~object((object *)&local_60);
  }
  else {
    src_local.m_ptr._7_1_ = 0;
    local_48 = 1;
  }
LAB_001d5971:
  object::~object((object *)&load_src);
  return (bool)(src_local.m_ptr._7_1_ & 1);
}

Assistant:

bool load(handle src, bool) {
#if PY_VERSION_MAJOR < 3
        object temp;
#endif
        handle load_src = src;
        if (!src) {
            return false;
        } else if (!PyUnicode_Check(load_src.ptr())) {
#if PY_VERSION_MAJOR >= 3
            return false;
            // The below is a guaranteed failure in Python 3 when PyUnicode_Check returns false
#else
            temp = reinterpret_steal<object>(PyUnicode_FromObject(load_src.ptr()));
            if (!temp) { PyErr_Clear(); return false; }
            load_src = temp;
#endif
        }

        object utfNbytes = reinterpret_steal<object>(PyUnicode_AsEncodedString(
            load_src.ptr(), encoding, nullptr));
        if (!utfNbytes) { PyErr_Clear(); return false; }

        const CharT *buffer = reinterpret_cast<const CharT *>(PYBIND11_BYTES_AS_STRING(utfNbytes.ptr()));
        size_t length = (size_t) PYBIND11_BYTES_SIZE(utfNbytes.ptr()) / sizeof(CharT);
        if (UTF_N > 8) { buffer++; length--; } // Skip BOM for UTF-16/32
        value = StringType(buffer, length);
        return true;
    }